

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

bool __thiscall tinyxml2::XMLUnknown::ShallowEqual(XMLUnknown *this,XMLNode *compare)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  char *__s1;
  undefined4 extraout_var_00;
  char *__s2;
  bool bVar4;
  long *plVar2;
  
  iVar1 = (*compare->_vptr_XMLNode[0xb])(compare);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 == (long *)0x0) {
    bVar4 = false;
  }
  else {
    lVar3 = (**(code **)(*plVar2 + 0x48))(plVar2);
    if (lVar3 == 0) {
      __s1 = StrPair::GetStr((StrPair *)(plVar2 + 3));
    }
    else {
      __s1 = (char *)0x0;
    }
    iVar1 = (*(this->super_XMLNode)._vptr_XMLNode[9])(this);
    if (CONCAT44(extraout_var_00,iVar1) == 0) {
      __s2 = StrPair::GetStr(&(this->super_XMLNode)._value);
    }
    else {
      __s2 = (char *)0x0;
    }
    if (__s1 == __s2) {
      bVar4 = true;
    }
    else {
      iVar1 = strncmp(__s1,__s2,0x7fffffff);
      bVar4 = iVar1 == 0;
    }
  }
  return bVar4;
}

Assistant:

bool XMLUnknown::ShallowEqual( const XMLNode* compare ) const
{
    TIXMLASSERT( compare );
    const XMLUnknown* unknown = compare->ToUnknown();
    return ( unknown && XMLUtil::StringEqual( unknown->Value(), Value() ));
}